

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void dwt_encode_1_real(int *a,int dn,int sn,int cas)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  
  if (cas == 0) {
    if (0 < dn || 1 < sn) {
      if (0 < dn) {
        lVar8 = (long)(sn * 2 + -2);
        lVar4 = 2;
        uVar3 = 0;
        do {
          lVar5 = lVar4 + -2;
          if ((long)sn <= (long)uVar3) {
            lVar5 = lVar8;
          }
          uVar7 = uVar3 + 1;
          lVar9 = lVar8;
          if ((long)uVar7 < (long)sn) {
            lVar9 = lVar4;
          }
          lVar5 = ((long)a[lVar9] + (long)a[lVar5]) * 0x32c1;
          a[uVar3 * 2 + 1] = a[uVar3 * 2 + 1] - (int)((ulong)((uint)lVar5 & 0x1000) + lVar5 >> 0xd);
          lVar4 = lVar4 + 2;
          uVar3 = uVar7;
        } while ((uint)dn != uVar7);
      }
      uVar2 = 0xffffffff;
      if (0 < sn) {
        lVar8 = (long)(dn * 2 + -1);
        lVar4 = 1;
        uVar3 = 0;
        uVar7 = 0xffffffff;
        do {
          piVar6 = a + 1;
          if ((uVar3 != 0) && (piVar6 = a + lVar8, (long)uVar3 <= (long)dn)) {
            piVar6 = a + (uVar7 & 0xffffffff);
          }
          lVar5 = lVar8;
          if ((long)uVar3 < (long)dn) {
            lVar5 = lVar4;
          }
          lVar5 = ((long)a[lVar5] + (long)*piVar6) * 0x1b2;
          a[uVar3 * 2] = a[uVar3 * 2] - (int)((ulong)((uint)lVar5 & 0x1000) + lVar5 >> 0xd);
          uVar3 = uVar3 + 1;
          uVar7 = uVar7 + 2;
          lVar4 = lVar4 + 2;
        } while ((uint)sn != uVar3);
      }
      if (0 < dn) {
        lVar8 = (long)(sn * 2 + -2);
        lVar4 = 2;
        uVar3 = 0;
        do {
          lVar5 = lVar4 + -2;
          if ((long)sn <= (long)uVar3) {
            lVar5 = lVar8;
          }
          uVar7 = uVar3 + 1;
          lVar9 = lVar8;
          if ((long)uVar7 < (long)sn) {
            lVar9 = lVar4;
          }
          lVar5 = ((long)a[lVar9] + (long)a[lVar5]) * 0x1c41;
          a[uVar3 * 2 + 1] = a[uVar3 * 2 + 1] + (int)((ulong)((uint)lVar5 & 0x1000) + lVar5 >> 0xd);
          lVar4 = lVar4 + 2;
          uVar3 = uVar7;
        } while ((uint)dn != uVar7);
      }
      if (0 < sn) {
        lVar8 = (long)(dn * 2 + -1);
        lVar4 = 1;
        uVar3 = 0;
        do {
          piVar6 = a + 1;
          if ((uVar3 != 0) && (piVar6 = a + lVar8, (long)uVar3 <= (long)dn)) {
            piVar6 = a + uVar2;
          }
          lVar5 = lVar8;
          if ((long)uVar3 < (long)dn) {
            lVar5 = lVar4;
          }
          lVar5 = ((long)a[lVar5] + (long)*piVar6) * 0xe31;
          a[uVar3 * 2] = a[uVar3 * 2] + (int)((ulong)((uint)lVar5 & 0x1000) + lVar5 >> 0xd);
          uVar3 = uVar3 + 1;
          uVar2 = uVar2 + 2;
          lVar4 = lVar4 + 2;
        } while ((uint)sn != uVar3);
      }
      if (0 < dn) {
        uVar3 = 0;
        do {
          a[uVar3 * 2 + 1] =
               (int)((ulong)((uint)((long)a[uVar3 * 2 + 1] * 0x13ae) & 0x1000) +
                     (long)a[uVar3 * 2 + 1] * 0x13ae >> 0xd);
          uVar3 = uVar3 + 1;
        } while ((uint)dn != uVar3);
      }
      if (0 < sn) {
        uVar3 = 0;
        do {
          a[uVar3 * 2] = (int)((ulong)((uint)((long)a[uVar3 * 2] * 0x1a03) & 0x1000) +
                               (long)a[uVar3 * 2] * 0x1a03 >> 0xd);
          uVar3 = uVar3 + 1;
        } while ((uint)sn != uVar3);
      }
    }
  }
  else if (1 < dn || 0 < sn) {
    uVar7 = 0xffffffff;
    lVar8 = (long)sn;
    uVar3 = (ulong)(uint)dn;
    if (0 < dn) {
      lVar4 = (long)(sn * 2 + -1);
      lVar5 = 1;
      uVar11 = 0;
      uVar12 = 0xffffffff;
      do {
        lVar9 = lVar4;
        if ((long)uVar11 < lVar8) {
          lVar9 = lVar5;
        }
        piVar6 = a + 1;
        if ((uVar11 != 0) && (piVar6 = a + lVar4, (long)uVar11 <= lVar8)) {
          piVar6 = a + (uVar12 & 0xffffffff);
        }
        lVar9 = ((long)*piVar6 + (long)a[lVar9]) * 0x32c1;
        a[uVar11 * 2] = a[uVar11 * 2] - (int)((ulong)((uint)lVar9 & 0x1000) + lVar9 >> 0xd);
        uVar11 = uVar11 + 1;
        uVar12 = uVar12 + 2;
        lVar5 = lVar5 + 2;
      } while (uVar3 != uVar11);
    }
    lVar4 = (long)dn;
    uVar11 = (ulong)(uint)sn;
    if (0 < sn) {
      lVar9 = (long)(dn * 2 + -2);
      lVar5 = 2;
      uVar12 = 0;
      do {
        lVar13 = lVar5 + -2;
        if (lVar4 <= (long)uVar12) {
          lVar13 = lVar9;
        }
        uVar1 = uVar12 + 1;
        lVar10 = lVar9;
        if ((long)uVar1 < lVar4) {
          lVar10 = lVar5;
        }
        lVar13 = ((long)a[lVar10] + (long)a[lVar13]) * 0x1b2;
        a[uVar12 * 2 + 1] =
             a[uVar12 * 2 + 1] - (int)((ulong)((uint)lVar13 & 0x1000) + lVar13 >> 0xd);
        lVar5 = lVar5 + 2;
        uVar12 = uVar1;
      } while (uVar11 != uVar1);
    }
    if (0 < dn) {
      lVar5 = (long)(sn * 2 + -1);
      lVar9 = 1;
      uVar12 = 0;
      do {
        lVar13 = lVar5;
        if ((long)uVar12 < lVar8) {
          lVar13 = lVar9;
        }
        piVar6 = a + 1;
        if ((uVar12 != 0) && (piVar6 = a + lVar5, (long)uVar12 <= lVar8)) {
          piVar6 = a + (uVar7 & 0xffffffff);
        }
        lVar13 = ((long)*piVar6 + (long)a[lVar13]) * 0x1c41;
        a[uVar12 * 2] = a[uVar12 * 2] + (int)((ulong)((uint)lVar13 & 0x1000) + lVar13 >> 0xd);
        uVar12 = uVar12 + 1;
        uVar7 = uVar7 + 2;
        lVar9 = lVar9 + 2;
      } while (uVar3 != uVar12);
    }
    if (0 < sn) {
      lVar8 = (long)(dn * 2 + -2);
      lVar5 = 2;
      uVar7 = 0;
      do {
        lVar9 = lVar5 + -2;
        if (lVar4 <= (long)uVar7) {
          lVar9 = lVar8;
        }
        uVar12 = uVar7 + 1;
        lVar13 = lVar8;
        if ((long)uVar12 < lVar4) {
          lVar13 = lVar5;
        }
        lVar9 = ((long)a[lVar13] + (long)a[lVar9]) * 0xe31;
        a[uVar7 * 2 + 1] = a[uVar7 * 2 + 1] + (int)((ulong)((uint)lVar9 & 0x1000) + lVar9 >> 0xd);
        lVar5 = lVar5 + 2;
        uVar7 = uVar12;
      } while (uVar11 != uVar12);
    }
    if (0 < dn) {
      uVar7 = 0;
      do {
        a[uVar7 * 2] = (int)((ulong)((uint)((long)a[uVar7 * 2] * 0x13ae) & 0x1000) +
                             (long)a[uVar7 * 2] * 0x13ae >> 0xd);
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
    if (0 < sn) {
      uVar3 = 0;
      do {
        a[uVar3 * 2 + 1] =
             (int)((ulong)((uint)((long)a[uVar3 * 2 + 1] * 0x1a03) & 0x1000) +
                   (long)a[uVar3 * 2 + 1] * 0x1a03 >> 0xd);
        uVar3 = uVar3 + 1;
      } while (uVar11 != uVar3);
    }
  }
  return;
}

Assistant:

static void dwt_encode_1_real(int *a, int dn, int sn, int cas) {
	int i;
	if (!cas) {
		if ((dn > 0) || (sn > 1)) {	/* NEW :  CASE ONE ELEMENT */
			for (i = 0; i < dn; i++)
				D(i) -= fix_mul(S_(i) + S_(i + 1), 12993);
			for (i = 0; i < sn; i++)
				S(i) -= fix_mul(D_(i - 1) + D_(i), 434);
			for (i = 0; i < dn; i++)
				D(i) += fix_mul(S_(i) + S_(i + 1), 7233);
			for (i = 0; i < sn; i++)
				S(i) += fix_mul(D_(i - 1) + D_(i), 3633);
			for (i = 0; i < dn; i++)
				D(i) = fix_mul(D(i), 5038);	/*5038 */
			for (i = 0; i < sn; i++)
				S(i) = fix_mul(S(i), 6659);	/*6660 */
		}
	} else {
		if ((sn > 0) || (dn > 1)) {	/* NEW :  CASE ONE ELEMENT */
			for (i = 0; i < dn; i++)
				S(i) -= fix_mul(DD_(i) + DD_(i - 1), 12993);
			for (i = 0; i < sn; i++)
				D(i) -= fix_mul(SS_(i) + SS_(i + 1), 434);
			for (i = 0; i < dn; i++)
				S(i) += fix_mul(DD_(i) + DD_(i - 1), 7233);
			for (i = 0; i < sn; i++)
				D(i) += fix_mul(SS_(i) + SS_(i + 1), 3633);
			for (i = 0; i < dn; i++)
				S(i) = fix_mul(S(i), 5038);	/*5038 */
			for (i = 0; i < sn; i++)
				D(i) = fix_mul(D(i), 6659);	/*6660 */
		}
	}
}